

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaevo.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t local_28;
  uint32_t ctrl;
  uint32_t d;
  uint32_t m;
  int cnum;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _cnum = argv;
  argv_local._0_4_ = argc;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    d = 0;
    while (m = getopt((int)argv_local,_cnum,"c:"), m != 0xffffffff) {
      if (m == 99) {
        __isoc99_sscanf(_optarg,"%d",&d);
      }
    }
    if ((int)d < nva_cardsnum) {
      if ((int)argv_local < _optind + 3) {
        fprintf(_stderr,"%s: <channel> <method> <data>\n",*_cnum);
        argv_local._4_4_ = 1;
      }
      else {
        __isoc99_sscanf(_cnum[_optind],"%d",&m);
        __isoc99_sscanf(_cnum[_optind + 1],"%x",&ctrl);
        __isoc99_sscanf(_cnum[_optind + 2],"%x",&local_28);
        if ((nva_cards[(int)d]->chipset).chipset < 0xd0) {
          if (((nva_cards[(int)d]->chipset).chipset != 0x50) &&
             ((nva_cards[(int)d]->chipset).chipset < 0x84)) {
            fprintf(_stderr,"unsupported chipset\n");
            return 1;
          }
          uVar2 = nva_rd32(d,m * 8 + 0x610300);
          nva_wr32(d,m * 8 + 0x610300,uVar2 | 1);
          nva_wr32(d,m * 8 + 0x610304,local_28);
          nva_wr32(d,m * 8 + 0x610300,ctrl | 0x80000001);
          do {
            uVar3 = nva_rd32(d,m * 8 + 0x610300);
          } while ((uVar3 & 0x80000000) != 0);
          nva_wr32(d,m * 8 + 0x610300,uVar2);
        }
        else {
          uVar2 = nva_rd32(d,m * 8 + 0x610700);
          nva_wr32(d,m * 8 + 0x610700,uVar2 | 1);
          nva_wr32(d,m * 8 + 0x610704,local_28);
          nva_wr32(d,m * 8 + 0x610700,ctrl | 0x80000001);
          do {
            uVar3 = nva_rd32(d,m * 8 + 0x610700);
          } while ((uVar3 & 0x80000000) != 0);
          nva_wr32(d,m * 8 + 0x610700,uVar2);
        }
        argv_local._4_4_ = 0;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	uint32_t m, d, ctrl;
	if (optind + 3 > argc) {
		fprintf (stderr, "%s: <channel> <method> <data>\n", argv[0]);
		return 1;
	}
	sscanf (argv[optind + 0], "%d", &c);
	sscanf (argv[optind + 1], "%x", &m);
	sscanf (argv[optind + 2], "%x", &d);

	if (nva_cards[cnum]->chipset.chipset >= 0xd0) {
		ctrl = nva_rd32(cnum, 0x610700 + (c * 8));
		nva_wr32(cnum, 0x610700 + (c * 8), ctrl | 1);
		nva_wr32(cnum, 0x610704 + (c * 8), d);
		nva_wr32(cnum, 0x610700 + (c * 8), 0x80000001 | m);
		while (nva_rd32(cnum, 0x610700 + (c * 8)) & 0x80000000);
		nva_wr32(cnum, 0x610700 + (c * 8), ctrl);
	} else
	if (nva_cards[cnum]->chipset.chipset == 0x50 ||
	    nva_cards[cnum]->chipset.chipset >= 0x84) {
		ctrl = nva_rd32(cnum, 0x610300 + (c * 8));
		nva_wr32(cnum, 0x610300 + (c * 8), ctrl | 1);
		nva_wr32(cnum, 0x610304 + (c * 8), d);
		nva_wr32(cnum, 0x610300 + (c * 8), 0x80000001 | m);
		while (nva_rd32(cnum, 0x610300 + (c * 8)) & 0x80000000);
		nva_wr32(cnum, 0x610300 + (c * 8), ctrl);
	} else {
		fprintf (stderr, "unsupported chipset\n");
		return 1;
	}

	return 0;
}